

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

int cJSON_GetArraySize(cJSON *array)

{
  int iVar1;
  cJSON *pcVar2;
  
  pcVar2 = (cJSON *)&array->child;
  iVar1 = -1;
  do {
    pcVar2 = pcVar2->next;
    iVar1 = iVar1 + 1;
  } while (pcVar2 != (cJSON *)0x0);
  return iVar1;
}

Assistant:

CJSON_PUBLIC(int) cJSON_GetArraySize(const cJSON *array)
{
    cJSON *c = array->child;
    size_t i = 0;
    while(c)
    {
        i++;
        c = c->next;
    }

    /* FIXME: Can overflow here. Cannot be fixed without breaking the API */

    return (int)i;
}